

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall
psy::C::SyntaxDumper::visitIncompleteDeclaration
          (SyntaxDumper *this,IncompleteDeclarationSyntax *node)

{
  SyntaxToken local_58;
  SpecifierListSyntax *local_20;
  SpecifierListSyntax *it;
  IncompleteDeclarationSyntax *node_local;
  SyntaxDumper *this_local;
  
  it = (SpecifierListSyntax *)node;
  node_local = (IncompleteDeclarationSyntax *)this;
  traverseDeclaration(this,&node->super_DeclarationSyntax);
  for (local_20 = IncompleteDeclarationSyntax::specifiers((IncompleteDeclarationSyntax *)it);
      local_20 != (SpecifierListSyntax *)0x0;
      local_20 = (local_20->
                 super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                 ).
                 super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                 .next) {
    (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])
              (this,(local_20->
                    super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                    ).
                    super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                    .value);
  }
  IncompleteDeclarationSyntax::semicolonToken(&local_58,(IncompleteDeclarationSyntax *)it);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_58,it);
  SyntaxToken::~SyntaxToken(&local_58);
  return Skip;
}

Assistant:

virtual Action visitIncompleteDeclaration(const IncompleteDeclarationSyntax* node) override
    {
        traverseDeclaration(node);
        for (auto it = node->specifiers(); it; it = it->next)
            nonterminal(it->value);
        terminal(node->semicolonToken(), node);
        return Action::Skip;
    }